

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O3

axbStatus_t
test(axbVec_s *x0,axbVec_s *x1,axbVec_s *x2,axbVec_s *x3,axbScalar_s *alpha,axbScalar_s *beta,
    axbScalar_s *gamma,double *y0,double *y1,double *y2,double *y3,double a,double b,double c)

{
  undefined1 auVar1 [16];
  axbVec_s *paVar2;
  axbVec_s *paVar3;
  ulong uVar4;
  axbStatus_t aVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *__format;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  size_t idx0;
  axbScalar_s *scalars [3];
  axbVec_s *vecs [3];
  ulong local_e0;
  axbVec_s *local_d8;
  axbVec_s *local_d0;
  double *local_c8;
  double local_c0;
  double local_b8;
  axbScalar_s *local_b0;
  double local_a8;
  double dStack_a0;
  size_t local_90;
  double local_88;
  double local_80;
  axbVec_s *local_78;
  axbVec_s *local_70;
  axbScalar_s *local_68;
  axbScalar_s *local_60;
  axbScalar_s *local_58;
  axbVec_s *local_48;
  axbVec_s *local_40;
  axbVec_s *local_38;
  
  local_d8 = x1;
  local_d0 = x2;
  local_c0 = a;
  local_b0 = beta;
  local_88 = c;
  local_80 = b;
  aVar5 = axbVecGetSize(x1,&local_e0);
  if (aVar5 == 0) {
    pdVar6 = (double *)malloc(local_e0 << 3);
    local_b8 = 0.0;
    aVar5 = axbVecSet(x0,alpha);
    auVar1 = _DAT_0010a030;
    if (aVar5 == 0) {
      if (local_e0 != 0) {
        lVar7 = local_e0 - 1;
        auVar11._8_4_ = (int)lVar7;
        auVar11._0_8_ = lVar7;
        auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar8 = 0;
        auVar11 = auVar11 ^ _DAT_0010a030;
        auVar13 = _DAT_0010a020;
        do {
          auVar14 = auVar13 ^ auVar1;
          if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                      auVar11._4_4_ < auVar14._4_4_) & 1)) {
            y0[uVar8] = local_c0;
          }
          if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
              auVar14._12_4_ <= auVar11._12_4_) {
            y0[uVar8 + 1] = local_c0;
          }
          uVar8 = uVar8 + 2;
          lVar7 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar7 + 2;
        } while ((local_e0 + 1 & 0xfffffffffffffffe) != uVar8);
      }
      check_equal(x0,y0,pdVar6,"axbVecSet");
      aVar5 = axbVecSqrtAbs(x0);
      if (aVar5 == 0) {
        if (local_e0 != 0) {
          uVar8 = 0;
          do {
            y0[uVar8] = SQRT(ABS(y0[uVar8]));
            uVar8 = uVar8 + 1;
          } while (local_e0 != uVar8);
        }
        check_equal(x0,y0,pdVar6,"axbVecSqrtAbs");
        aVar5 = axbVecZero(x0);
        if (aVar5 == 0) {
          if (local_e0 != 0) {
            memset(y0,0,local_e0 << 3);
          }
          check_equal(x0,y0,pdVar6,"axbVecZero");
          aVar5 = axbVecScale(local_d8,alpha);
          paVar2 = local_d8;
          if (aVar5 == 0) {
            if (local_e0 != 0) {
              uVar8 = 0;
              do {
                y1[uVar8] = y1[uVar8] * local_c0;
                uVar8 = uVar8 + 1;
              } while (local_e0 != uVar8);
            }
            local_70 = x3;
            check_equal(local_d8,y1,pdVar6,"axbVecScale");
            aVar5 = axbVecSum(paVar2,alpha);
            if (aVar5 == 0) {
              dVar10 = 0.0;
              if (local_e0 != 0) {
                uVar8 = 0;
                do {
                  dVar10 = dVar10 + y1[uVar8];
                  uVar8 = uVar8 + 1;
                } while (local_e0 != uVar8);
              }
              check_equal_scalar(alpha,dVar10,"axbVecSum");
              aVar5 = axbVecDot(local_d8,local_d0,alpha);
              if (aVar5 == 0) {
                dVar10 = 0.0;
                if (local_e0 != 0) {
                  uVar8 = 0;
                  do {
                    dVar10 = dVar10 + y1[uVar8] * y2[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (local_e0 != uVar8);
                }
                local_c8 = pdVar6;
                check_equal_scalar(alpha,dVar10,"axbVecDot");
                aVar5 = axbVecTDot(local_d8,local_d0,alpha);
                if (aVar5 == 0) {
                  dVar10 = 0.0;
                  if (local_e0 != 0) {
                    uVar8 = 0;
                    do {
                      dVar10 = dVar10 + y1[uVar8] * y2[uVar8];
                      uVar8 = uVar8 + 1;
                    } while (local_e0 != uVar8);
                  }
                  check_equal_scalar(alpha,dVar10,"axbVecTDot");
                  aVar5 = axbVecNorm1(local_d8,alpha);
                  if (aVar5 == 0) {
                    dVar10 = 0.0;
                    if (local_e0 != 0) {
                      uVar8 = 0;
                      do {
                        dVar10 = dVar10 + ABS(y1[uVar8]);
                        uVar8 = uVar8 + 1;
                      } while (local_e0 != uVar8);
                    }
                    check_equal_scalar(alpha,dVar10,"axbVecNorm1");
                    aVar5 = axbVecNorm2(local_d8,alpha);
                    if (aVar5 == 0) {
                      dVar10 = 0.0;
                      if (local_e0 != 0) {
                        uVar8 = 0;
                        do {
                          dVar10 = dVar10 + y1[uVar8] * y1[uVar8];
                          uVar8 = uVar8 + 1;
                        } while (local_e0 != uVar8);
                      }
                      if (dVar10 < 0.0) {
                        dVar10 = sqrt(dVar10);
                      }
                      else {
                        dVar10 = SQRT(dVar10);
                      }
                      check_equal_scalar(alpha,dVar10,"axbVecNorm2");
                      aVar5 = axbVecNormInf(local_d8,alpha);
                      if (aVar5 == 0) {
                        if (local_e0 == 0) {
                          dVar10 = 0.0;
                        }
                        else {
                          uVar8 = 0;
                          dVar12 = 0.0;
                          do {
                            dVar10 = ABS(y1[uVar8]);
                            if (ABS(y1[uVar8]) <= dVar12) {
                              dVar10 = dVar12;
                            }
                            uVar8 = uVar8 + 1;
                            dVar12 = dVar10;
                          } while (local_e0 != uVar8);
                        }
                        check_equal_scalar(alpha,dVar10,"axbVecNormInf");
                        aVar5 = axbVecDotNorm2(local_d8,local_d0,alpha,local_b0);
                        if (aVar5 == 0) {
                          local_b8 = 0.0;
                          dVar10 = 0.0;
                          dStack_a0 = 0.0;
                          if (local_e0 != 0) {
                            uVar8 = 0;
                            do {
                              dVar12 = y2[uVar8];
                              dVar10 = dVar10 + dVar12 * y1[uVar8];
                              dStack_a0 = dStack_a0 + dVar12 * dVar12;
                              uVar8 = uVar8 + 1;
                              local_b8 = dVar10;
                            } while (local_e0 != uVar8);
                          }
                          local_a8 = local_b8;
                          check_equal_scalar(alpha,local_b8,"axbVecDotNorm2, alpha");
                          if (dStack_a0 < 0.0) {
                            dVar10 = sqrt(dStack_a0);
                          }
                          else {
                            dVar10 = SQRT(dStack_a0);
                          }
                          check_equal_scalar(local_b0,dVar10,"axbVecDotNorm2, beta");
                          local_90 = 0;
                          aVar5 = axbVecMax(local_d8,&local_90,alpha);
                          if (aVar5 == 0) {
                            local_a8 = *y1;
                            if (local_e0 < 2) {
                              uVar8 = 0;
                            }
                            else {
                              uVar9 = 1;
                              uVar8 = 0;
                              do {
                                dVar10 = y1[uVar9];
                                uVar4 = uVar9;
                                if (y1[uVar9] <= local_a8) {
                                  dVar10 = local_a8;
                                  uVar4 = uVar8;
                                }
                                uVar8 = uVar4;
                                local_a8 = dVar10;
                                uVar9 = uVar9 + 1;
                              } while (local_e0 != uVar9);
                            }
                            local_78 = x0;
                            aVar5 = axbScalarGetValue(alpha,&local_b8,AXB_REAL_DOUBLE);
                            if (aVar5 == 0) {
                              if (local_90 != uVar8) {
                                __format = 
                                "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n";
LAB_00106913:
                                fprintf(_stderr,__format,local_b8,local_a8,local_90,uVar8);
                                exit(1);
                              }
                              check_equal_scalar(alpha,local_a8,"axbVecMax");
                              local_90 = 0;
                              aVar5 = axbVecMin(local_d8,&local_90,alpha);
                              if (aVar5 == 0) {
                                local_a8 = *y1;
                                if (local_e0 < 2) {
                                  uVar8 = 0;
                                }
                                else {
                                  uVar9 = 1;
                                  uVar8 = 0;
                                  do {
                                    dVar10 = y1[uVar9];
                                    uVar4 = uVar9;
                                    if (local_a8 <= y1[uVar9]) {
                                      dVar10 = local_a8;
                                      uVar4 = uVar8;
                                    }
                                    uVar8 = uVar4;
                                    local_a8 = dVar10;
                                    uVar9 = uVar9 + 1;
                                  } while (local_e0 != uVar9);
                                }
                                aVar5 = axbScalarGetValue(alpha,&local_b8,AXB_REAL_DOUBLE);
                                if (aVar5 == 0) {
                                  if (local_90 != uVar8) {
                                    __format = 
                                    "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n";
                                    goto LAB_00106913;
                                  }
                                  check_equal_scalar(alpha,local_a8,"axbVecMin");
                                  paVar2 = local_78;
                                  aVar5 = axbVecCopy(local_d8,local_78);
                                  pdVar6 = local_c8;
                                  if (aVar5 == 0) {
                                    if (local_e0 != 0) {
                                      uVar8 = 0;
                                      do {
                                        y0[uVar8] = y1[uVar8];
                                        uVar8 = uVar8 + 1;
                                      } while (local_e0 != uVar8);
                                    }
                                    check_equal(paVar2,y0,local_c8,"axbVecCopy, x0");
                                    check_equal(local_d8,y1,pdVar6,"axbVecCopy, x1");
                                    aVar5 = axbVecSwap(paVar2,local_d0);
                                    pdVar6 = local_c8;
                                    if (aVar5 == 0) {
                                      if (local_e0 != 0) {
                                        uVar8 = 0;
                                        do {
                                          dVar10 = y0[uVar8];
                                          y0[uVar8] = y2[uVar8];
                                          y2[uVar8] = dVar10;
                                          uVar8 = uVar8 + 1;
                                        } while (local_e0 != uVar8);
                                      }
                                      check_equal(paVar2,y0,local_c8,"axbVecSwap, x0");
                                      check_equal(local_d0,y2,pdVar6,"axbVecSwap, x2");
                                      aVar5 = axbScalarGetValue(alpha,&local_c0,AXB_REAL_DOUBLE);
                                      if (aVar5 == 0) {
                                        aVar5 = axbScalarGetValue(local_b0,&local_80,AXB_REAL_DOUBLE
                                                                 );
                                        if (aVar5 == 0) {
                                          aVar5 = axbScalarGetValue(gamma,&local_88,AXB_REAL_DOUBLE)
                                          ;
                                          if (aVar5 == 0) {
                                            aVar5 = axbVecAXPY(paVar2,alpha,local_d8);
                                            if (aVar5 == 0) {
                                              if (local_e0 != 0) {
                                                uVar8 = 0;
                                                do {
                                                  y0[uVar8] = y1[uVar8] * local_c0 + y0[uVar8];
                                                  uVar8 = uVar8 + 1;
                                                } while (local_e0 != uVar8);
                                              }
                                              check_equal(paVar2,y0,local_c8,"axbVecAXPY");
                                              aVar5 = axbVecAYPX(paVar2,alpha,local_d8);
                                              if (aVar5 == 0) {
                                                if (local_e0 != 0) {
                                                  uVar8 = 0;
                                                  do {
                                                    y0[uVar8] = y0[uVar8] * local_c0 + y1[uVar8];
                                                    uVar8 = uVar8 + 1;
                                                  } while (local_e0 != uVar8);
                                                }
                                                check_equal(paVar2,y0,local_c8,"axbVecAYPX");
                                                aVar5 = axbVecAXPBYPCZ(local_d0,alpha,local_b0,gamma
                                                                       ,paVar2,local_d8);
                                                paVar3 = local_d0;
                                                if (aVar5 == 0) {
                                                  if (local_e0 != 0) {
                                                    uVar8 = 0;
                                                    do {
                                                      y2[uVar8] = y2[uVar8] * local_88 +
                                                                  y0[uVar8] * local_c0 +
                                                                  y1[uVar8] * local_80;
                                                      uVar8 = uVar8 + 1;
                                                    } while (local_e0 != uVar8);
                                                  }
                                                  check_equal(local_d0,y2,local_c8,"axbVecAXPBYPCZ")
                                                  ;
                                                  aVar5 = axbVecWAXPY(paVar3,alpha,paVar2,local_d8);
                                                  paVar3 = local_d0;
                                                  if (aVar5 == 0) {
                                                    if (local_e0 != 0) {
                                                      uVar8 = 0;
                                                      do {
                                                        y2[uVar8] = y0[uVar8] * local_c0 + y1[uVar8]
                                                        ;
                                                        uVar8 = uVar8 + 1;
                                                      } while (local_e0 != uVar8);
                                                    }
                                                    check_equal(local_d0,y2,local_c8,"axbVecWAXPY");
                                                    local_48 = local_d8;
                                                    local_40 = paVar3;
                                                    local_38 = local_70;
                                                    local_60 = local_b0;
                                                    local_58 = gamma;
                                                    local_68 = alpha;
                                                    aVar5 = axbVecMAXPY(paVar2,3,&local_68,&local_48
                                                                       );
                                                    if (aVar5 == 0) {
                                                      if (local_e0 != 0) {
                                                        uVar8 = 0;
                                                        do {
                                                          y0[uVar8] = y3[uVar8] * local_88 +
                                                                      y1[uVar8] * local_c0 +
                                                                      y2[uVar8] * local_80 +
                                                                      y0[uVar8];
                                                          uVar8 = uVar8 + 1;
                                                        } while (local_e0 != uVar8);
                                                      }
                                                      check_equal(paVar2,y0,local_c8,"axbVecMAXPY");
                                                      aVar5 = axbVecPointwiseMult(paVar2,local_d8,
                                                                                  local_d0);
                                                      if (aVar5 == 0) {
                                                        if (local_e0 != 0) {
                                                          uVar8 = 0;
                                                          do {
                                                            y0[uVar8] = y1[uVar8] * y2[uVar8];
                                                            uVar8 = uVar8 + 1;
                                                          } while (local_e0 != uVar8);
                                                        }
                                                        check_equal(paVar2,y0,local_c8,
                                                                    "axbVecPointwiseMult");
                                                        aVar5 = axbVecPointwiseDivide
                                                                          (paVar2,local_d8,local_d0)
                                                        ;
                                                        pdVar6 = local_c8;
                                                        if (aVar5 == 0) {
                                                          if (local_e0 != 0) {
                                                            uVar8 = 0;
                                                            do {
                                                              y0[uVar8] = y1[uVar8] / y2[uVar8];
                                                              uVar8 = uVar8 + 1;
                                                            } while (local_e0 != uVar8);
                                                          }
                                                          check_equal(paVar2,y0,local_c8,
                                                                      "axbVecPointwiseDivide");
                                                          free(pdVar6);
                                                          aVar5 = 0;
                                                        }
                                                        else {
                                                          test_cold_28();
                                                        }
                                                      }
                                                      else {
                                                        test_cold_27();
                                                      }
                                                    }
                                                    else {
                                                      test_cold_26();
                                                    }
                                                  }
                                                  else {
                                                    test_cold_25();
                                                  }
                                                }
                                                else {
                                                  test_cold_24();
                                                }
                                              }
                                              else {
                                                test_cold_23();
                                              }
                                            }
                                            else {
                                              test_cold_22();
                                            }
                                          }
                                          else {
                                            test_cold_21();
                                          }
                                        }
                                        else {
                                          test_cold_20();
                                        }
                                      }
                                      else {
                                        test_cold_19();
                                      }
                                    }
                                    else {
                                      test_cold_18();
                                    }
                                  }
                                  else {
                                    test_cold_17();
                                  }
                                }
                                else {
                                  test_cold_16();
                                }
                              }
                              else {
                                test_cold_15();
                              }
                            }
                            else {
                              test_cold_14();
                            }
                          }
                          else {
                            test_cold_13();
                          }
                        }
                        else {
                          test_cold_12();
                        }
                      }
                      else {
                        test_cold_11();
                      }
                    }
                    else {
                      test_cold_10();
                    }
                  }
                  else {
                    test_cold_9();
                  }
                }
                else {
                  test_cold_8();
                }
              }
              else {
                test_cold_7();
              }
            }
            else {
              test_cold_6();
            }
          }
          else {
            test_cold_5();
          }
        }
        else {
          test_cold_4();
        }
      }
      else {
        test_cold_3();
      }
    }
    else {
      test_cold_2();
    }
  }
  else {
    test_cold_1();
  }
  return aVar5;
}

Assistant:

axbStatus_t test(struct axbVec_s *x0, struct axbVec_s *x1, struct axbVec_s *x2, struct axbVec_s *x3, struct axbScalar_s *alpha, struct axbScalar_s *beta, struct axbScalar_s *gamma,
                 double *y0, double *y1, double *y2, double *y3, double a, double b, double c)
{
  size_t n;
  AXB_ERR_CHECK(axbVecGetSize(x1, &n));
  double *temp = malloc(sizeof(double) * n);
  double t = 0;
  double s = 0;



  //
  // in-place operations
  //

  // AXB_OP_VEC_SET
  AXB_ERR_CHECK(axbVecSet(x0, alpha));
  for (size_t i=0; i<n; ++i) y0[i] = a;
  check_equal(x0, y0, temp, "axbVecSet");

  // AXB_OP_VEC_SQRTABS
  AXB_ERR_CHECK(axbVecSqrtAbs(x0));
  for (size_t i=0; i<n; ++i) y0[i] = sqrt(fabs(y0[i]));
  check_equal(x0, y0, temp, "axbVecSqrtAbs");

  // AXB_OP_VEC_ZERO
  AXB_ERR_CHECK(axbVecZero(x0));
  for (size_t i=0; i<n; ++i) y0[i] = 0;
  check_equal(x0, y0, temp, "axbVecZero");

  // AXB_OP_VEC_SCALE
  AXB_ERR_CHECK(axbVecScale(x1, alpha));
  for (size_t i=0; i<n; ++i) y1[i] *= a;
  check_equal(x1, y1, temp, "axbVecScale");



  //
  // reduction operations
  //

  //AXB_OP_VEC_SUM
  AXB_ERR_CHECK(axbVecSum(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i];
  check_equal_scalar(alpha, t, "axbVecSum");


  //AXB_OP_VEC_DOT
  AXB_ERR_CHECK(axbVecDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecDot");

  //AXB_OP_VEC_TDOT
  AXB_ERR_CHECK(axbVecTDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecTDot");

  //AXB_OP_VEC_MDOT
  // skipping: tested separately

  //AXB_OP_VEC_NORM1
  AXB_ERR_CHECK(axbVecNorm1(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += fabs(y1[i]);
  check_equal_scalar(alpha, t, "axbVecNorm1");

  //AXB_OP_VEC_NORM2
  AXB_ERR_CHECK(axbVecNorm2(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y1[i];
  check_equal_scalar(alpha, sqrt(t), "axbVecNorm2");

  //AXB_OP_VEC_NORMINF
  AXB_ERR_CHECK(axbVecNormInf(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t = fabs(y1[i]) > t ? fabs(y1[i]) : t;
  check_equal_scalar(alpha, t, "axbVecNormInf");

  //AXB_OP_VEC_DOTNORM2
  AXB_ERR_CHECK(axbVecDotNorm2(x1, x2, alpha, beta));
  t=0;
  s=0;
  for (size_t i=0; i<n; ++i) { s += y1[i] * y2[i]; t += y2[i] * y2[i]; }
  check_equal_scalar(alpha, s, "axbVecDotNorm2, alpha");
  check_equal_scalar(beta, sqrt(t), "axbVecDotNorm2, beta");

  //AXB_OP_VEC_MAX
  size_t idx0 = 0;
  AXB_ERR_CHECK(axbVecMax(x1, &idx0, alpha));
  t=y1[0];
  size_t idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] > t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMax");

  //AXB_OP_VEC_MIN
  idx0 = 0;
  AXB_ERR_CHECK(axbVecMin(x1, &idx0, alpha));
  t=y1[0];
  idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] < t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMin");



  //
  // vector-vector operations
  //

  //AXB_OP_VEC_COPY
  AXB_ERR_CHECK(axbVecCopy(x1, x0));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i];
  check_equal(x0, y0, temp, "axbVecCopy, x0");
  check_equal(x1, y1, temp, "axbVecCopy, x1");

  //AXB_OP_VEC_SWAP
  AXB_ERR_CHECK(axbVecSwap(x0, x2));
  for (size_t i=0; i<n; ++i) { t = y0[i]; y0[i] = y2[i]; y2[i] = t; }
  check_equal(x0, y0, temp, "axbVecSwap, x0");
  check_equal(x2, y2, temp, "axbVecSwap, x2");

  AXB_ERR_CHECK(axbScalarGetValue(alpha, &a, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(beta,  &b, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(gamma, &c, AXB_REAL_DOUBLE));  // reset

  //AXB_OP_VEC_AXPY
  AXB_ERR_CHECK(axbVecAXPY(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i];
  check_equal(x0, y0, temp, "axbVecAXPY");

  //AXB_OP_VEC_AYPX
  AXB_ERR_CHECK(axbVecAYPX(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] = a * y0[i] + y1[i];
  check_equal(x0, y0, temp, "axbVecAYPX");

  //AXB_OP_VEC_AXPBYPCZ
  AXB_ERR_CHECK(axbVecAXPBYPCZ(x2, alpha, beta, gamma, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + b * y1[i] + c * y2[i];
  check_equal(x2, y2, temp, "axbVecAXPBYPCZ");

  //AXB_OP_VEC_WAXPY
  AXB_ERR_CHECK(axbVecWAXPY(x2, alpha, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + y1[i];
  check_equal(x2, y2, temp, "axbVecWAXPY");

  //AXB_OP_VEC_MAXPY
  struct axbVec_s *vecs[3] = {x1, x2, x3};
  struct axbScalar_s *scalars[3] = {alpha, beta, gamma};
  AXB_ERR_CHECK(axbVecMAXPY(x0, 3, (const struct axbScalar_s * const*)scalars, (const struct axbVec_s * const*)vecs));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i] + b * y2[i] + c * y3[i];
  check_equal(x0, y0, temp, "axbVecMAXPY");

  //AXB_OP_VEC_POINTWISEMULT
  AXB_ERR_CHECK(axbVecPointwiseMult(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] * y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseMult");

  //AXB_OP_VEC_POINTWISEDIV
  AXB_ERR_CHECK(axbVecPointwiseDivide(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] / y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseDivide");

  free(temp);
  return 0;
}